

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_do_generalize_script_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object script_window;
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  Am_Object AStack_28;
  Am_Value_List local_20;
  Am_Object local_10;
  
  Am_Object::Get_Object((Am_Object *)&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_20,10);
  Am_Object::~Am_Object((Am_Object *)&local_20);
  pAVar2 = Am_Object::Get(&AStack_28,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&local_10,pAVar2);
  pAVar2 = Am_Object::Get(&local_10,0x171,3);
  Am_Value_List::Am_Value_List(&local_20,pAVar2);
  bVar1 = Am_Value_List::Valid(&local_20);
  if (bVar1) {
    Am_Pop_Up_Generalize_DB(&AStack_28,&local_20);
  }
  Am_Value_List::~Am_Value_List(&local_20);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&AStack_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_do_generalize_script,
                 (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid())
    Am_Pop_Up_Generalize_DB(script_window, sel_list);
}